

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControl.cpp
# Opt level: O0

void __thiscall
Rml::ElementFormControl::OnAttributeChange
          (ElementFormControl *this,ElementAttributes *changed_attributes)

{
  bool bVar1;
  Property local_b8;
  allocator<char> local_51;
  String local_50;
  byte local_29;
  const_iterator cStack_28;
  bool is_disabled;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_20;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  *local_18;
  ElementAttributes *changed_attributes_local;
  ElementFormControl *this_local;
  
  local_18 = changed_attributes;
  changed_attributes_local = (ElementAttributes *)this;
  Element::OnAttributeChange(&this->super_Element,changed_attributes);
  local_20._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
        *)itlib::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::find<char[9]>(local_18,(char (*) [9])"disabled");
  cStack_28 = itlib::
              flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
              ::end(local_18);
  bVar1 = __gnu_cxx::operator!=(&local_20,&stack0xffffffffffffffd8);
  if (bVar1) {
    local_29 = IsDisabled(this);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"disabled",&local_51);
    Element::SetPseudoClass(&this->super_Element,&local_50,(bool)(local_29 & 1));
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::allocator<char>::~allocator(&local_51);
    if ((local_29 & 1) == 0) {
      Element::RemoveProperty(&this->super_Element,Focus);
    }
    else {
      Property::Property<Rml::Style::Focus,Rml::Style::Focus>(&local_b8,None);
      Element::SetProperty(&this->super_Element,Focus,&local_b8);
      Property::~Property(&local_b8);
      Element::Blur(&this->super_Element);
    }
  }
  return;
}

Assistant:

void ElementFormControl::OnAttributeChange(const ElementAttributes& changed_attributes)
{
	Element::OnAttributeChange(changed_attributes);

	if (changed_attributes.find("disabled") != changed_attributes.end())
	{
		bool is_disabled = IsDisabled();
		SetPseudoClass("disabled", is_disabled);

		// Disable focus when element is disabled. This will also prevent click
		// events (when originating from user inputs, see Context) to reach the element.
		if (is_disabled)
		{
			SetProperty(PropertyId::Focus, Property(Style::Focus::None));
			Blur();
		}
		else
			RemoveProperty(PropertyId::Focus);
	}
}